

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_timedwait.c
# Opt level: O0

void test_relative_timeout(ALLEGRO_EVENT_QUEUE *queue)

{
  byte bVar1;
  undefined8 in_RDI;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  undefined8 uVar5;
  float shade;
  ALLEGRO_EVENT event;
  float local_54;
  int local_50 [8];
  int local_30;
  undefined8 local_8;
  
  local_54 = 0.1;
  local_8 = in_RDI;
  do {
    bVar1 = al_wait_for_event_timed(0x3dcccccd,local_8,local_50);
    if ((bVar1 & 1) == 0) {
      local_54 = local_54 + 0.1;
      if (1.0 < local_54) {
        local_54 = 1.0;
      }
    }
    else if (local_50[0] == 10) {
      if (local_30 == 0x3b) {
        return;
      }
      local_54 = 0.1;
    }
    dVar2 = (double)local_54 * 0.5;
    dVar4 = (double)local_54 * 0.25;
    uVar5 = CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4);
    uVar3 = al_map_rgba_f(CONCAT44((int)((ulong)dVar2 >> 0x20),(float)dVar2),uVar5,local_54,0);
    al_clear_to_color(uVar3,uVar5);
    al_flip_display();
  } while( true );
}

Assistant:

static void test_relative_timeout(ALLEGRO_EVENT_QUEUE *queue)
{
   ALLEGRO_EVENT event;
   float shade = 0.1;

   while (true) {
      if (al_wait_for_event_timed(queue, &event, 0.1)) {
         if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
               return;
            }
            else {
               shade = 0.1;
            }
         }
      }
      else {
         /* timed out */
         shade += 0.1;
         if (shade > 1.0)
            shade = 1.0;
      }

      al_clear_to_color(al_map_rgba_f(0.5 * shade, 0.25 * shade, shade, 0));
      al_flip_display();
   }
}